

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int select_cipher(ptls_cipher_suite_t **selected,ptls_cipher_suite_t **candidates,uint8_t *src,
                 uint8_t *end)

{
  ushort uVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_cipher_suite_t **pppVar3;
  
  while( true ) {
    if (src == end) {
      return 0x28;
    }
    if ((long)end - (long)src < 2) break;
    uVar1 = *(ushort *)src;
    src = (uint8_t *)((long)src + 2);
    pppVar3 = candidates;
    while (ppVar2 = *pppVar3, ppVar2 != (ptls_cipher_suite_t *)0x0) {
      pppVar3 = pppVar3 + 1;
      if (ppVar2->id == (uint16_t)(uVar1 << 8 | uVar1 >> 8)) {
        *selected = ppVar2;
        return 0;
      }
    }
  }
  return 0x32;
}

Assistant:

static int select_cipher(ptls_cipher_suite_t **selected, ptls_cipher_suite_t **candidates, const uint8_t *src,
                         const uint8_t *const end)
{
    int ret;

    while (src != end) {
        uint16_t id;
        if ((ret = ptls_decode16(&id, &src, end)) != 0)
            goto Exit;
        ptls_cipher_suite_t **c = candidates;
        for (; *c != NULL; ++c) {
            if ((*c)->id == id) {
                *selected = *c;
                return 0;
            }
        }
    }

    ret = PTLS_ALERT_HANDSHAKE_FAILURE;

Exit:
    return ret;
}